

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# happly.h
# Opt level: O0

void __thiscall
happly::TypedProperty<short>::writeHeader(TypedProperty<short> *this,ostream *outStream)

{
  ostream *poVar1;
  ostream *in_RSI;
  long in_RDI;
  string local_30 [48];
  
  poVar1 = std::operator<<(in_RSI,"property ");
  typeName<short>();
  poVar1 = std::operator<<(poVar1,local_30);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,(string *)(in_RDI + 8));
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

virtual void writeHeader(std::ostream& outStream) override {
    outStream << "property " << typeName<T>() << " " << name << "\n";
  }